

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtriebuilder.h
# Opt level: O2

void __thiscall
icu_63::StringTrieBuilder::Node::writeUnlessInsideRightEdge
          (Node *this,int32_t firstRight,int32_t lastRight,StringTrieBuilder *builder)

{
  int iVar1;
  
  iVar1 = this->offset;
  if ((iVar1 < 0) && (iVar1 < lastRight || firstRight < iVar1)) {
    (*(this->super_UObject)._vptr_UObject[5])(this,builder);
    return;
  }
  return;
}

Assistant:

inline void writeUnlessInsideRightEdge(int32_t firstRight, int32_t lastRight,
                                               StringTrieBuilder &builder) {
            // Note: Edge numbers are negative, lastRight<=firstRight.
            // If offset>0 then this node and its sub-nodes have been written already
            // and we need not write them again.
            // If this node is part of the unwritten right branch edge,
            // then we wait until that is written.
            if(offset<0 && (offset<lastRight || firstRight<offset)) {
                write(builder);
            }
        }